

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O2

stumpless_param * stumpless_get_param_by_name(stumpless_element *element,char *name)

{
  _Bool _Var1;
  int iVar2;
  char *message;
  ulong uVar3;
  stumpless_param *param;
  size_t name_length;
  size_t local_30;
  
  if (element == (stumpless_element *)0x0) {
    message = "element was NULL";
  }
  else {
    if (name != (char *)0x0) {
      _Var1 = validate_param_name(name,&local_30);
      if (!_Var1) {
        return (stumpless_param *)0x0;
      }
      clear_error();
      lock_element(element);
      uVar3 = 0;
      do {
        if (element->param_count <= uVar3) {
          raise_param_not_found();
          param = (stumpless_param *)0x0;
          break;
        }
        param = element->params[uVar3];
        lock_param(param);
        iVar2 = strcmp(param->name,name);
        unlock_param(param);
        uVar3 = uVar3 + 1;
      } while (iVar2 != 0);
      unlock_element(element);
      return param;
    }
    message = "name was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_param *)0x0;
}

Assistant:

struct stumpless_param *
stumpless_get_param_by_name( const struct stumpless_element *element,
                             const char *name ) {
  size_t name_length;
  size_t i;
  struct stumpless_param *param;
  int cmp_result;

  VALIDATE_ARG_NOT_NULL( element );
  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_param_name( name, &name_length ) ) ) {
    return NULL;
  }

  clear_error(  );
  lock_element( element );
  FOR_EACH_PARAM_WITH_NAME( element, name )
    goto cleanup_and_return;
  }